

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(EnvironmentNAVXYTHETALAT *this)

{
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *this_00;
  pointer ppEVar1;
  pointer ppEVar2;
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *pvVar3;
  reference ppEVar4;
  long lVar5;
  size_type __n;
  
  (this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
  _vptr_DiscreteSpaceInformation = (_func_int **)&PTR_InitializeEnv_0015e7e0;
  this_00 = &this->StateID2CoordTable;
  __n = 0;
  while( true ) {
    ppEVar1 = (this->StateID2CoordTable).
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->StateID2CoordTable).
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)(int)((ulong)((long)ppEVar2 - (long)ppEVar1) >> 3) <= (long)__n) break;
    ppEVar4 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::at(this_00,__n);
    operator_delete(*ppEVar4,0x14);
    ppEVar4 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::at(this_00,__n);
    *ppEVar4 = (value_type)0x0;
    __n = __n + 1;
  }
  if (ppEVar2 != ppEVar1) {
    (this->StateID2CoordTable).
    super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar1;
  }
  pvVar3 = this->Coord2StateIDHashTable;
  if (pvVar3 != (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                 *)0x0) {
    ppEVar1 = pvVar3[-1].
              super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppEVar1 != (pointer)0x0) {
      lVar5 = (long)ppEVar1 * 0x18;
      do {
        std::
        _Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
        ::~_Vector_base((_Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                         *)((long)&pvVar3[-1].
                                   super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0);
    }
    operator_delete__(&pvVar3[-1].
                       super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppEVar1 * 0x18 + 8);
    this->Coord2StateIDHashTable =
         (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
         0x0;
  }
  if (this->Coord2StateIDHashTable_lookup != (EnvNAVXYTHETALATHashEntry_t **)0x0) {
    operator_delete__(this->Coord2StateIDHashTable_lookup);
    this->Coord2StateIDHashTable_lookup = (EnvNAVXYTHETALATHashEntry_t **)0x0;
  }
  std::_Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  ~_Vector_base(&this_00->
                 super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
               );
  EnvironmentNAVXYTHETALATTICE::~EnvironmentNAVXYTHETALATTICE
            (&this->super_EnvironmentNAVXYTHETALATTICE);
  return;
}

Assistant:

EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT()
{
    SBPL_PRINTF("destroying XYTHETALAT\n");

    // delete the states themselves first
    for (int i = 0; i < (int)StateID2CoordTable.size(); i++) {
        delete StateID2CoordTable.at(i);
        StateID2CoordTable.at(i) = NULL;
    }
    StateID2CoordTable.clear();

    // delete hashtable
    if (Coord2StateIDHashTable != NULL) {
        delete[] Coord2StateIDHashTable;
        Coord2StateIDHashTable = NULL;
    }
    if (Coord2StateIDHashTable_lookup != NULL) {
        delete[] Coord2StateIDHashTable_lookup;
        Coord2StateIDHashTable_lookup = NULL;
    }
}